

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkMap(Abc_Ntk_t *pNtk,double DelayTarget,double AreaMulti,double DelayMulti,float LogFan,
          float Slew,float Gain,int nGatesMin,int fRecovery,int fSwitching,int fSkipFanout,
          int fUseProfile,int fUseBuffs,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  void *pvVar3;
  Mio_Library_t *pMVar4;
  Map_SuperLib_t *p;
  char *pcVar5;
  char *pcVar6;
  Map_Man_t *p_00;
  Abc_Ntk_t *pAVar7;
  abctime aVar8;
  bool local_a1;
  Mio_Library_t *local_90;
  Mio_Library_t *pLib;
  abctime clkTotal;
  abctime clk;
  float *pSwitching;
  Vec_Int_t *vSwitching;
  Map_Man_t *pMan;
  Abc_Ntk_t *pNtkNew;
  int fShowSwitching;
  int fUseProfile_local;
  int fSkipFanout_local;
  int fSwitching_local;
  int fRecovery_local;
  int nGatesMin_local;
  float Gain_local;
  float Slew_local;
  float LogFan_local;
  double DelayMulti_local;
  double AreaMulti_local;
  double DelayTarget_local;
  Abc_Ntk_t *pNtk_local;
  
  pSwitching = (float *)0x0;
  clk = 0;
  aVar2 = Abc_Clock();
  local_90 = (Mio_Library_t *)Abc_FrameReadLibGen();
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x48,
                  "Abc_Ntk_t *Abc_NtkMap(Abc_Ntk_t *, double, double, double, float, float, float, int, int, int, int, int, int, int)"
                 );
  }
  pvVar3 = Abc_FrameReadLibScl();
  if (pvVar3 != (void *)0x0) {
    pvVar3 = Abc_FrameReadLibScl();
    iVar1 = Abc_SclHasDelayInfo(pvVar3);
    if (iVar1 != 0) {
      if ((local_90 == (Mio_Library_t *)0x0) ||
         (iVar1 = Mio_LibraryHasProfile(local_90), iVar1 == 0)) {
        pvVar3 = Abc_FrameReadLibScl();
        local_90 = Abc_SclDeriveGenlib(pvVar3,(void *)0x0,Slew,Gain,nGatesMin,fVerbose);
      }
      else {
        pvVar3 = Abc_FrameReadLibScl();
        local_90 = Abc_SclDeriveGenlib(pvVar3,local_90,Slew,Gain,nGatesMin,fVerbose);
      }
      pvVar3 = Abc_FrameReadLibGen();
      if (pvVar3 != (void *)0x0) {
        pMVar4 = (Mio_Library_t *)Abc_FrameReadLibGen();
        Mio_LibraryTransferDelays(pMVar4,local_90);
        pMVar4 = (Mio_Library_t *)Abc_FrameReadLibGen();
        Mio_LibraryTransferProfile(local_90,pMVar4);
      }
      p = (Map_SuperLib_t *)Abc_FrameReadLibSuper();
      Map_SuperLibFree(p);
      Abc_FrameSetLibSuper((void *)0x0);
    }
  }
  if (local_90 == (Mio_Library_t *)0x0) {
    printf("The current library is not available.\n");
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if ((AreaMulti != 0.0) || (NAN(AreaMulti))) {
      Abc_NtkMap::fUseMulti = 1;
      printf("The cell areas are multiplied by the factor: <num_fanins> ^ (%.2f).\n",AreaMulti);
    }
    if ((DelayMulti != 0.0) || (NAN(DelayMulti))) {
      Abc_NtkMap::fUseMulti = 1;
      printf("The cell delays are multiplied by the factor: <num_fanins> ^ (%.2f).\n",DelayMulti);
    }
    if ((AreaMulti != 0.0) || (NAN(AreaMulti))) {
      Mio_LibraryMultiArea(local_90,AreaMulti);
    }
    if ((DelayMulti != 0.0) || (NAN(DelayMulti))) {
      Mio_LibraryMultiDelay(local_90,DelayMulti);
    }
    if ((Abc_NtkMap::fUseMulti != 0) || (pvVar3 = Abc_FrameReadLibSuper(), pvVar3 == (void *)0x0)) {
      if (fVerbose != 0) {
        pcVar5 = Mio_LibraryReadName(local_90);
        pcVar6 = Mio_LibraryReadName(local_90);
        pcVar6 = Extra_FileNameGenericAppend(pcVar6,".super");
        printf("Converting \"%s\" into supergate library \"%s\".\n",pcVar5,pcVar6);
      }
      iVar1 = Mio_LibraryHasProfile(local_90);
      if (iVar1 != 0) {
        printf("Abc_NtkMap(): Genlib library has profile.\n");
      }
      Map_SuperLibDeriveFromGenlib(local_90,fVerbose);
    }
    if ((AreaMulti != 0.0) || (NAN(AreaMulti))) {
      pMVar4 = (Mio_Library_t *)Abc_FrameReadLibGen();
      Mio_LibraryMultiArea(pMVar4,-AreaMulti);
    }
    if ((DelayMulti != 0.0) || (NAN(DelayMulti))) {
      pMVar4 = (Mio_Library_t *)Abc_FrameReadLibGen();
      Mio_LibraryMultiDelay(pMVar4,-DelayMulti);
    }
    if ((fVerbose != 0) && (iVar1 = Abc_NtkGetChoiceNum(pNtk), iVar1 != 0)) {
      printf("Performing mapping with choices.\n");
    }
    if ((fSwitching | 1U) != 0) {
      pSwitching = (float *)Sim_NtkComputeSwitching(pNtk,0x1000);
      clk = (abctime)((Vec_Int_t *)pSwitching)->pArray;
    }
    p_00 = Abc_NtkToMap(pNtk,DelayTarget,fRecovery,(float *)clk,fVerbose);
    if (clk != 0) {
      Vec_IntFree((Vec_Int_t *)pSwitching);
    }
    if (p_00 == (Map_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      Abc_Clock();
      Map_ManSetSwitching(p_00,fSwitching);
      Map_ManSetSkipFanout(p_00,fSkipFanout);
      if (fUseProfile != 0) {
        Map_ManSetUseProfile(p_00);
      }
      if ((LogFan != 0.0) || (NAN(LogFan))) {
        Map_ManCreateNodeDelays(p_00,(int)LogFan);
      }
      iVar1 = Map_Mapping(p_00);
      if (iVar1 == 0) {
        Map_ManFree(p_00);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      else {
        local_a1 = fUseBuffs != 0 || DelayTarget == 1000000000.0;
        pNtk_local = Abc_NtkFromMap(p_00,pNtk,(uint)local_a1);
        iVar1 = Mio_LibraryHasProfile(local_90);
        if (iVar1 != 0) {
          pMVar4 = (Mio_Library_t *)Abc_FrameReadLibGen();
          Mio_LibraryTransferProfile2(pMVar4,local_90);
        }
        Map_ManFree(p_00);
        if (pNtk_local == (Abc_Ntk_t *)0x0) {
          pNtk_local = (Abc_Ntk_t *)0x0;
        }
        else {
          if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
            pAVar7 = Abc_NtkDup(pNtk->pExdc);
            pNtk_local->pExdc = pAVar7;
          }
          if (fVerbose != 0) {
            Abc_Print(1,"%s =","Total runtime");
            aVar8 = Abc_Clock();
            Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar2) * 1.0) / 1000000.0);
          }
          iVar1 = Abc_NtkCheck(pNtk_local);
          if (iVar1 == 0) {
            printf("Abc_NtkMap: The network check has failed.\n");
            Abc_NtkDelete(pNtk_local);
            pNtk_local = (Abc_Ntk_t *)0x0;
          }
        }
      }
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkMap( Abc_Ntk_t * pNtk, double DelayTarget, double AreaMulti, double DelayMulti, float LogFan, float Slew, float Gain, int nGatesMin, int fRecovery, int fSwitching, int fSkipFanout, int fUseProfile, int fUseBuffs, int fVerbose )
{
    static int fUseMulti = 0;
    int fShowSwitching = 1;
    Abc_Ntk_t * pNtkNew;
    Map_Man_t * pMan;
    Vec_Int_t * vSwitching = NULL;
    float * pSwitching = NULL;
    abctime clk, clkTotal = Abc_Clock();
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();

    assert( Abc_NtkIsStrash(pNtk) );
    // derive library from SCL
    // if the library is created here, it will be deleted when pSuperLib is deleted in Map_SuperLibFree()
    if ( Abc_FrameReadLibScl() && Abc_SclHasDelayInfo( Abc_FrameReadLibScl() ) )
    {
        if ( pLib && Mio_LibraryHasProfile(pLib) )
            pLib = Abc_SclDeriveGenlib( Abc_FrameReadLibScl(), pLib, Slew, Gain, nGatesMin, fVerbose );
        else
            pLib = Abc_SclDeriveGenlib( Abc_FrameReadLibScl(), NULL, Slew, Gain, nGatesMin, fVerbose );
        if ( Abc_FrameReadLibGen() )
        {
            Mio_LibraryTransferDelays( (Mio_Library_t *)Abc_FrameReadLibGen(), pLib );
            Mio_LibraryTransferProfile( pLib, (Mio_Library_t *)Abc_FrameReadLibGen() );
        }
        // remove supergate library
        Map_SuperLibFree( (Map_SuperLib_t *)Abc_FrameReadLibSuper() );
        Abc_FrameSetLibSuper( NULL );
    }
    // quit if there is no library
    if ( pLib == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }
    if ( AreaMulti != 0.0 )
        fUseMulti = 1, printf( "The cell areas are multiplied by the factor: <num_fanins> ^ (%.2f).\n", AreaMulti );
    if ( DelayMulti != 0.0 )
        fUseMulti = 1, printf( "The cell delays are multiplied by the factor: <num_fanins> ^ (%.2f).\n", DelayMulti );

    // penalize large gates by increasing their area
    if ( AreaMulti != 0.0 )
        Mio_LibraryMultiArea( pLib, AreaMulti );
    if ( DelayMulti != 0.0 )
        Mio_LibraryMultiDelay( pLib, DelayMulti );

    // derive the supergate library
    if ( fUseMulti || Abc_FrameReadLibSuper() == NULL )
    {
        if ( fVerbose )
            printf( "Converting \"%s\" into supergate library \"%s\".\n", 
                Mio_LibraryReadName(pLib), Extra_FileNameGenericAppend(Mio_LibraryReadName(pLib), ".super") );
        // compute supergate library to be used for mapping
        if ( Mio_LibraryHasProfile(pLib) )
            printf( "Abc_NtkMap(): Genlib library has profile.\n" );
        Map_SuperLibDeriveFromGenlib( pLib, fVerbose );
    }

    // return the library to normal
    if ( AreaMulti != 0.0 )
        Mio_LibraryMultiArea( (Mio_Library_t *)Abc_FrameReadLibGen(), -AreaMulti );
    if ( DelayMulti != 0.0 )
        Mio_LibraryMultiDelay( (Mio_Library_t *)Abc_FrameReadLibGen(), -DelayMulti );

    // print a warning about choice nodes
    if ( fVerbose && Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing mapping with choices.\n" );

    // compute switching activity
    fShowSwitching |= fSwitching;
    if ( fShowSwitching )
    {
        extern Vec_Int_t * Sim_NtkComputeSwitching( Abc_Ntk_t * pNtk, int nPatterns );
        vSwitching = Sim_NtkComputeSwitching( pNtk, 4096 );
        pSwitching = (float *)vSwitching->pArray;
    }

    // perform the mapping
    pMan = Abc_NtkToMap( pNtk, DelayTarget, fRecovery, pSwitching, fVerbose );
    if ( pSwitching ) Vec_IntFree( vSwitching );
    if ( pMan == NULL )
        return NULL;
clk = Abc_Clock();
    Map_ManSetSwitching( pMan, fSwitching );
    Map_ManSetSkipFanout( pMan, fSkipFanout );
    if ( fUseProfile )
        Map_ManSetUseProfile( pMan );
    if ( LogFan != 0 )
        Map_ManCreateNodeDelays( pMan, LogFan );
    if ( !Map_Mapping( pMan ) )
    {
        Map_ManFree( pMan );
        return NULL;
    }
//    Map_ManPrintStatsToFile( pNtk->pSpec, Map_ManReadAreaFinal(pMan), Map_ManReadRequiredGlo(pMan), Abc_Clock()-clk );

    // reconstruct the network after mapping (use buffers when user requested or in the area mode)
    pNtkNew = Abc_NtkFromMap( pMan, pNtk, fUseBuffs || (DelayTarget == (double)ABC_INFINITY) );
    if ( Mio_LibraryHasProfile(pLib) )
        Mio_LibraryTransferProfile2( (Mio_Library_t *)Abc_FrameReadLibGen(), pLib );
    Map_ManFree( pMan );
    if ( pNtkNew == NULL )
        return NULL;

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
if ( fVerbose )
{
ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
}

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMap: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}